

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddCMP0018Flags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  bool bVar1;
  TargetType targetType;
  TargetType TVar2;
  string local_50;
  
  targetType = cmGeneratorTarget::GetType(target);
  TVar2 = targetType & ~STATIC_LIBRARY;
  bVar1 = GetShouldUseOldFlags(this,TVar2 == SHARED_LIBRARY,lang);
  if (bVar1) {
    AddSharedFlags(this,flags,lang,TVar2 == SHARED_LIBRARY);
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"POSITION_INDEPENDENT_CODE","");
  bVar1 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty(target,&local_50,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    AddPositionIndependentFlags(this,flags,lang,targetType);
  }
  if (TVar2 == SHARED_LIBRARY) {
    AppendFeatureOptions(this,flags,lang,"DLL");
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCMP0018Flags(std::string& flags,
                                       cmGeneratorTarget const* target,
                                       std::string const& lang,
                                       const std::string& config)
{
  int targetType = target->GetType();

  bool shared = ((targetType == cmStateEnums::SHARED_LIBRARY) ||
                 (targetType == cmStateEnums::MODULE_LIBRARY));

  if (this->GetShouldUseOldFlags(shared, lang)) {
    this->AddSharedFlags(flags, lang, shared);
  } else {
    if (target->GetLinkInterfaceDependentBoolProperty(
          "POSITION_INDEPENDENT_CODE", config)) {
      this->AddPositionIndependentFlags(flags, lang, targetType);
    }
    if (shared) {
      this->AppendFeatureOptions(flags, lang, "DLL");
    }
  }
}